

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FsmCollection.hpp
# Opt level: O3

vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
* __thiscall
peach::fsm::FsmCollection::tokenizeText
          (vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
           *__return_storage_ptr__,FsmCollection *this,string *text,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *reservedKeywords)

{
  size_type sVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer ppVar4;
  Token *pTVar5;
  _Alloc_hider _Var6;
  long *plVar7;
  int iVar8;
  type *keyword;
  pointer ppVar9;
  size_type sVar10;
  unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *token;
  pointer puVar11;
  bool bVar12;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  sVar1 = text->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (text->_M_dataplus)._M_p;
    sVar10 = 0;
    do {
      pushNextChar(this,pcVar2[sVar10],__return_storage_ptr__);
      sVar10 = sVar10 + 1;
    } while (sVar1 != sVar10);
    pushNextChar(this,'\0',__return_storage_ptr__);
    puVar11 = (__return_storage_ptr__->
              super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar11 != puVar3) {
      do {
        ppVar4 = (reservedKeywords->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar9 = (reservedKeywords->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar4;
            ppVar9 = ppVar9 + 1) {
          pTVar5 = (puVar11->_M_t).
                   super___uniq_ptr_impl<peach::token::Token,_std::default_delete<peach::token::Token>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_peach::token::Token_*,_std::default_delete<peach::token::Token>_>
                   .super__Head_base<0UL,_peach::token::Token_*,_false>._M_head_impl;
          _Var6._M_p = (pTVar5->token_)._M_dataplus._M_p;
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,_Var6._M_p,_Var6._M_p + (pTVar5->token_)._M_string_length);
          plVar7 = local_50;
          if (local_48 == (ppVar9->first)._M_string_length) {
            if (local_48 == 0) {
              bVar12 = true;
            }
            else {
              iVar8 = bcmp(local_50,(ppVar9->first)._M_dataplus._M_p,local_48);
              bVar12 = iVar8 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if (plVar7 != local_40) {
            operator_delete(plVar7,local_40[0] + 1);
          }
          if (bVar12) {
            ((puVar11->_M_t).
             super___uniq_ptr_impl<peach::token::Token,_std::default_delete<peach::token::Token>_>.
             _M_t.
             super__Tuple_impl<0UL,_peach::token::Token_*,_std::default_delete<peach::token::Token>_>
             .super__Head_base<0UL,_peach::token::Token_*,_false>._M_head_impl)->category_ =
                 ppVar9->second;
          }
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<token::Token>> tokenizeText(const std::string &text,
                                                            const std::vector<std::pair<std::string, token::tokenCategory_t>> &reservedKeywords)
    {
        if (text.empty())
        {
            return {};
        }
        std::vector<std::unique_ptr<token::Token>> tokens;
        auto processChar = [&](char c) {
            pushNextChar(c, tokens);
        };
        std::for_each(text.begin(), text.end(), processChar);
        processChar('\0');
        for (const auto &token : tokens)
        {
            for (const auto &[keyword, category] : reservedKeywords)
            {
                if (token->getTokenString() == keyword)
                {
                    token->setCategory(category);
                }
            }
        }
        return tokens;
    }